

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O3

ptr<Value> __thiscall Assignment::evaluate(Assignment *this,Environment *env)

{
  Scope scope;
  size_type sVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  long lVar9;
  undefined4 *puVar10;
  Identifier *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  ptr<Value> pVar12;
  ptr<Value> currValue;
  __node_base_ptr local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  undefined1 local_88 [32];
  ptr<Value> local_68;
  __node_base_ptr local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  sVar1 = (env->symbols)._M_h._M_bucket_count;
  if ((sVar1 != 0) &&
     (lVar9 = __dynamic_cast(sVar1,&Expression::typeinfo,&Symbol::typeinfo,0), lVar9 != 0)) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (env->symbols)._M_h._M_before_begin._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    bVar8 = Environment::hasSymbol((Environment *)in_RDX,(Identifier *)(lVar9 + 8));
    if (bVar8) {
      Environment::getValue((Environment *)local_88,in_RDX);
      (*(code *)**(undefined8 **)(env->symbols)._M_h._M_element_count)(&local_98);
      plVar2 = (long *)(env->symbols)._M_h._M_rehash_policy._M_next_resize;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x30))(&local_58,plVar2,local_88,&local_98);
        p_Var3 = p_Stack_50;
        local_98 = local_58;
        this_01 = p_Stack_90;
        local_58 = (__node_base_ptr)0x0;
        p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Stack_90 = p_Var3;
        if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
           p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        }
      }
      scope = *(Scope *)(lVar9 + 0x2c);
      local_68.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_98;
      local_68.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_90;
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Stack_90->_M_use_count = p_Stack_90->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Stack_90->_M_use_count = p_Stack_90->_M_use_count + 1;
        }
      }
      Environment::putValue
                ((Environment *)in_RDX,(Identifier *)(lVar9 + 8),scope,&local_68,
                 *(bool *)(lVar9 + 0x28));
      _Var11._M_pi = extraout_RDX;
      if (local_68.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
        _Var11._M_pi = extraout_RDX_00;
      }
      (this->super_BinaryOperator).super_Expression._vptr_Expression = (_func_int **)0x0;
      (this->super_BinaryOperator).leftExpression.
      super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
        _Var11._M_pi = extraout_RDX_01;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        _Var11._M_pi = extraout_RDX_02;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var11._M_pi = extraout_RDX_03;
      }
      pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var11._M_pi;
      pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (ptr<Value>)pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  puVar10 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"The member is not defined","")
  ;
  ExceptionObjects::undefined((ExceptionObjects *)&local_48,(string *)local_88);
  uVar4 = (undefined4)local_48;
  uVar5 = local_48._4_4_;
  uVar6 = (undefined4)uStack_40;
  uVar7 = uStack_40._4_4_;
  local_48 = 0;
  uStack_40 = 0;
  *puVar10 = uVar4;
  puVar10[1] = uVar5;
  puVar10[2] = uVar6;
  puVar10[3] = uVar7;
  __cxa_throw(puVar10,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(leftExpression);

        if(!symbol || !(env -> hasSymbol(symbol -> name)))
            throw ThrowPacket(ExceptionObjects::undefined("The member is not defined"));

        ptr<Value> currValue = env -> getValue(symbol -> name);
        ptr<Value> newValue = rightExpression -> evaluate(env);

        if(operation)
            newValue = operation -> getResult(currValue, newValue);

        env -> putValue(symbol -> name, symbol -> scope, newValue, symbol -> constant);
        return nullptr;
    }